

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

void __thiscall
Eigen::PermutationMatrix<-1,-1,int>::
PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>,Eigen::PermutationMatrix<_1,_1,int>>
          (PermutationMatrix<_1,_1,int> *this,PermPermProduct_t param_1,
          PermutationMatrix<_1,__1,_int> *lhs,PermutationMatrix<_1,__1,_int> *rhs)

{
  EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  Index dim;
  PermutationMatrix<_1,__1,_int> *rhs_local;
  PermutationMatrix<_1,__1,_int> *lhs_local;
  PermPermProduct_t param_1_local;
  PermutationMatrix<_1,__1,_int> *this_local;
  
  this_00 = (EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)
            PermutationMatrix<-1,_-1,_int>::indices(lhs);
  dim = EigenBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::size(this_00);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)this,dim);
  PermutationBase<Eigen::PermutationMatrix<-1,-1,int>>::
  assignProduct<Eigen::PermutationMatrix<_1,_1,int>,Eigen::PermutationMatrix<_1,_1,int>>
            ((PermutationBase<Eigen::PermutationMatrix<_1,_1,int>> *)this,lhs,rhs);
  return;
}

Assistant:

PermutationMatrix(internal::PermPermProduct_t, const Lhs& lhs, const Rhs& rhs)
      : m_indices(lhs.indices().size())
    {
      Base::assignProduct(lhs,rhs);
    }